

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

ITexture * __thiscall
irr::video::CNullDriver::addTexture
          (CNullDriver *this,dimension2d<unsigned_int> *size,path *name,ECOLOR_FORMAT format)

{
  code *pcVar1;
  int iVar2;
  CImage *this_00;
  undefined4 extraout_var;
  _func_int *p_Var4;
  double in_XMM0_Qa;
  SSurface s;
  SSurface local_30;
  ITexture *pIVar3;
  
  if ((int)(name->str)._M_string_length == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,in_XMM0_Qa);
  }
  else {
    this_00 = (CImage *)operator_new(0x50);
    CImage::CImage(this_00,format,size);
    iVar2 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x75])(this,name,this_00);
    pIVar3 = (ITexture *)CONCAT44(extraout_var,iVar2);
    p_Var4 = (this_00->super_IImage)._vptr_IImage[-3];
    pcVar1 = p_Var4 + 4 + (long)&(this_00->super_IImage).Size.Width;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      p_Var4 = (_func_int *)((long)&(this_00->super_IImage)._vptr_IImage + (long)p_Var4);
      (**(code **)(*(long *)p_Var4 + 8))(p_Var4);
    }
    if (pIVar3 != (ITexture *)0x0) {
      *(int *)(pIVar3->_vptr_ITexture[-3] + 8 + (long)&(pIVar3->NamedPath).Path) =
           *(int *)(pIVar3->_vptr_ITexture[-3] + 8 + (long)&(pIVar3->NamedPath).Path) + 1;
      local_30.Surface = pIVar3;
      core::array<irr::video::CNullDriver::SSurface>::push_back
                ((array<irr::video::CNullDriver::SSurface> *)&(this->super_IVideoDriver).field_0x10,
                 &local_30);
      p_Var4 = pIVar3->_vptr_ITexture[-3];
      pcVar1 = p_Var4 + 8 + (long)&(pIVar3->NamedPath).Path;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 != 0) {
        return pIVar3;
      }
      (**(code **)(*(long *)((long)&pIVar3->_vptr_ITexture + (long)p_Var4) + 8))();
      return pIVar3;
    }
  }
  return (ITexture *)0x0;
}

Assistant:

ITexture *CNullDriver::addTexture(const core::dimension2d<u32> &size, const io::path &name, ECOLOR_FORMAT format)
{
	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	IImage *image = new CImage(format, size);
	ITexture *t = 0;

	if (checkImage(image)) {
		t = createDeviceDependentTexture(name, image);
	}

	image->drop();

	if (t) {
		addTexture(t);
		t->drop();
	}

	return t;
}